

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O0

err_t cmdCVCsFind(size_t *offset,octet *certs,size_t certs_len,octet *cert,size_t cert_len)

{
  bool_t bVar1;
  size_t sVar2;
  void *in_RCX;
  long in_RDX;
  void *in_RSI;
  long *in_RDI;
  size_t in_R8;
  size_t len;
  size_t pos;
  octet *in_stack_ffffffffffffffb8;
  long local_38;
  long local_20;
  void *local_18;
  
  local_38 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  while( true ) {
    if (local_20 == 0) {
      return 0x70;
    }
    sVar2 = btokCVCLen(in_stack_ffffffffffffffb8,0x104871);
    if (sVar2 == 0xffffffffffffffff) break;
    if ((sVar2 == in_R8) && (bVar1 = memEq(local_18,in_RCX,in_R8), bVar1 != 0)) {
      if (in_RDI != (long *)0x0) {
        *in_RDI = local_38;
      }
      return 0;
    }
    local_38 = sVar2 + local_38;
    local_18 = (void *)(sVar2 + (long)local_18);
    local_20 = local_20 - sVar2;
  }
  return 0x204;
}

Assistant:

err_t cmdCVCsFind(size_t* offset, const octet* certs, size_t certs_len,
	const octet* cert, size_t cert_len)
{
	size_t pos;
	// pre
	ASSERT(memIsValid(certs, certs_len));
	ASSERT(memIsValid(cert, cert_len));
	ASSERT(memIsNullOrValid(offset, O_PER_S));
	// цикл по сертификатам
	for (pos = 0; certs_len; )
	{
		size_t len = btokCVCLen(certs, certs_len);
		if (len == SIZE_MAX)
			return ERR_BAD_CERTRING;
		if (len == cert_len && memEq(certs, cert, cert_len))
		{
			if (offset)
				*offset = pos;
			return ERR_OK;
		}
		pos += len, certs += len, certs_len -= len;
	}
	return ERR_NOT_FOUND;
}